

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtmelSWISimulationDataGenerator.cpp
# Opt level: O3

void __thiscall
AtmelSWISimulationDataGenerator::OutputTokenZero(AtmelSWISimulationDataGenerator *this)

{
  uint uVar1;
  
  SimulationChannelDescriptor::Transition();
  uVar1 = (int)this + 0x18;
  ClockGenerator::AdvanceByTimeS(4.34e-06);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByTimeS(4.34e-06);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByTimeS(4.34e-06);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByTimeS(2.6e-05);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  return;
}

Assistant:

void AtmelSWISimulationDataGenerator::OutputTokenZero()
{
    mSDA->Transition(); // to low
    mSWISimulationChannels.AdvanceAll( mClockGenerator.AdvanceByTimeS( MICRO_SEC * 4.34 ) );
    mSDA->Transition(); // to high
    mSWISimulationChannels.AdvanceAll( mClockGenerator.AdvanceByTimeS( MICRO_SEC * 4.34 ) );
    mSDA->Transition(); // to low
    mSWISimulationChannels.AdvanceAll( mClockGenerator.AdvanceByTimeS( MICRO_SEC * 4.34 ) );
    mSDA->Transition(); // to high
    mSWISimulationChannels.AdvanceAll( mClockGenerator.AdvanceByTimeS( MICRO_SEC * 26 ) );
}